

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O0

void reset_oattached_mids(boolean ghostly,level *lev)

{
  boolean bVar1;
  monst *mtmp;
  uint nid;
  uint oldid;
  obj *otmp;
  level *lev_local;
  boolean ghostly_local;
  
  otmp = (obj *)lev;
  lev_local._7_1_ = ghostly;
  for (_nid = lev->objlist; _nid != (obj *)0x0; _nid = _nid->nobj) {
    if (((lev_local._7_1_ != '\0') && ((*(uint *)&_nid->field_0x4a >> 0x15 & 3) == 1)) &&
       (_nid->oxlth != 0)) {
      *(undefined4 *)((long)&_nid[1].olev + 4) = 0;
      *(undefined1 *)&_nid[1].oeaten = 0;
      _nid[1].age = _nid[1].age & 0xffbfffff;
    }
    if ((lev_local._7_1_ != '\0') && ((*(uint *)&_nid->field_0x4a >> 0x15 & 3) == 2)) {
      mtmp._4_4_ = _nid->oextra[0];
      bVar1 = lookup_id_mapping(mtmp._4_4_,(uint *)&mtmp);
      if (bVar1 == '\0') {
        *(uint *)&_nid->field_0x4a = *(uint *)&_nid->field_0x4a & 0xff9fffff;
      }
      else {
        _nid->oextra[0] = (int)mtmp;
      }
    }
  }
  return;
}

Assistant:

static void reset_oattached_mids(boolean ghostly, struct level *lev)
{
    struct obj *otmp;
    unsigned oldid, nid;
    for (otmp = lev->objlist; otmp; otmp = otmp->nobj) {
	if (ghostly && otmp->oattached == OATTACHED_MONST && otmp->oxlth) {
	    struct monst *mtmp = (struct monst *)otmp->oextra;

	    mtmp->m_id = 0;
	    mtmp->mpeaceful = mtmp->mtame = 0;	/* pet's owner died! */
	}
	if (ghostly && otmp->oattached == OATTACHED_M_ID) {
	    memcpy(&oldid, (void *)otmp->oextra, sizeof(oldid));
	    if (lookup_id_mapping(oldid, &nid))
		memcpy(otmp->oextra, (void *)&nid, sizeof(nid));
	    else
		otmp->oattached = OATTACHED_NOTHING;
	}
    }
}